

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O1

float pbrt::findCameraFov(SP *camera)

{
  _Base_ptr p_Var1;
  element_type *peVar2;
  undefined8 uVar3;
  float fVar4;
  undefined1 local_48 [16];
  _Base_ptr local_38 [4];
  
  peVar2 = (camera->super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (_Base_ptr)(local_38 + 2);
  local_38[0] = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"fov","");
  syntactic::ParamSet::findParam<float>
            ((ParamSet *)local_48,(string *)&(peVar2->super_Node).super_ParamSet);
  uVar3 = local_48._0_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
  }
  if (local_38[0] != p_Var1) {
    operator_delete(local_38[0]);
  }
  if (uVar3 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "warning - pbrt file has camera, but camera has no \'fov\' field; replacing with constant 30 degrees"
               ,0x61);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    fVar4 = 30.0;
  }
  else {
    peVar2 = (camera->super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    local_38[0] = p_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"fov","");
    syntactic::ParamSet::findParam<float>
              ((ParamSet *)local_48,(string *)&(peVar2->super_Node).super_ParamSet);
    fVar4 = **(float **)(local_48._0_8_ + 0x18);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
    }
    if (local_38[0] != p_Var1) {
      operator_delete(local_38[0]);
    }
  }
  return fVar4;
}

Assistant:

float findCameraFov(pbrt::syntactic::Camera::SP camera)
  {
    if (!camera->findParam<float>("fov")) {
      std::cerr << "warning - pbrt file has camera, but camera has no 'fov' field; replacing with constant 30 degrees" << std::endl;
      return 30;
    }
    return camera->findParam<float>("fov")->get(0);
  }